

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O0

void tsd_global_slow_dec(tsdn_t *tsdn)

{
  LOCK();
  tsd_global_slow_count.repr = tsd_global_slow_count.repr - 1;
  UNLOCK();
  tsd_force_recompute((tsdn_t *)0x100000000);
  return;
}

Assistant:

void tsd_global_slow_dec(tsdn_t *tsdn) {
	atomic_fetch_sub_u32(&tsd_global_slow_count, 1, ATOMIC_RELAXED);
	/* See the note in ..._inc(). */
	tsd_force_recompute(tsdn);
}